

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SlicerCore.cpp
# Opt level: O2

void SlicerCore::initFolder(void)

{
  return;
}

Assistant:

void SlicerCore::initFolder()
{
	//clear last time
	//rmdir();
	//mkdir
	//std::cerr << "init: mkdir" << std::endl;
	//mkdir("~/.slicer",S_IRWXU | S_IRWXG | S_IROTH | S_IXOTH);

	//ConfigManager::idSet = std::set<int64_t>();
}